

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

void wasm::anon_unknown_18::doCodeInlining
               (Module *module,Function *into,InliningAction *action,PassOptions *options)

{
  pointer *this;
  Function *this_00;
  Names *this_01;
  char *pcVar1;
  pointer pTVar2;
  long lVar3;
  Name name_00;
  Name name_01;
  PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
  *pPVar4;
  undefined8 this_02;
  bool bVar5;
  Index IVar6;
  int iVar7;
  Function *pFVar8;
  size_t sVar9;
  Type TVar10;
  mapped_type *pmVar11;
  Block *pBVar12;
  Return *pRVar13;
  Expression **ppEVar14;
  LocalSet *pLVar15;
  Break *pBVar16;
  PassOptions *pPVar17;
  undefined4 extraout_var;
  Expression *pEVar18;
  ulong uVar19;
  TaskFunc p_Var20;
  _Storage<wasm::Type,_true> _Var21;
  ExpressionList *pEVar22;
  string *in_R9;
  function<bool_(wasm::Name)> *check;
  uint uVar23;
  char **ppcVar24;
  PassOptions *this_03;
  Signature SVar25;
  string_view sVar26;
  Name NVar27;
  Name root;
  Name root_00;
  Name name_02;
  Name name_03;
  Name name_04;
  optional<wasm::Type> type_;
  Name name_05;
  Name root_01;
  Name name_06;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  Name target;
  optional<wasm::Type> type_02;
  string local_348 [32];
  string local_328 [32];
  undefined1 auStack_308 [8];
  Updater updater;
  undefined1 local_188 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  size_t local_160;
  Name local_158;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  initializer_list<wasm::Expression_*> local_108;
  Break *local_f8;
  char *local_f0;
  undefined1 auStack_e8 [8];
  Name name_1;
  NameSet intoNames;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  Block *local_80;
  Expression *contents;
  _Storage<wasm::Type,_true> local_70;
  BranchSeeker *local_68;
  InliningAction *local_60;
  size_t local_58;
  PassOptions *local_50;
  Function *local_48;
  Block *local_40;
  Expression *old;
  Builder builder;
  
  this_00 = action->contents;
  local_60 = action;
  local_48 = into;
  local_68 = (BranchSeeker *)Expression::cast<wasm::Call>(*action->callSite);
  pFVar8 = Module::getFunction(module,(Name)(local_68->
                                            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                            ).
                                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                            .stack.fixed._M_elems[2]);
  SVar25 = HeapType::getSignature(&pFVar8->type);
  local_70 = (_Storage<wasm::Type,_true>)SVar25.results.id;
  contents = (Expression *)module;
  old = (Expression *)module;
  local_40 = MixedArena::alloc<wasm::Block>(&module->allocator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_308,"__inlined_func$",(allocator<char> *)local_a0._M_pod_data);
  IString::toString_abi_cxx11_((string *)&name_1.super_IString.str._M_str,(IString *)this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_308,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &name_1.super_IString.str._M_str);
  ppcVar24 = &name_1.super_IString.str._M_str;
  std::__cxx11::string::~string((string *)ppcVar24);
  std::__cxx11::string::~string((string *)auStack_308);
  if (local_60->nameHint != 0) {
    std::__cxx11::to_string((string *)&name_1.super_IString.str._M_str,local_60->nameHint);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_308,
                   '$',(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &name_1.super_IString.str._M_str);
    std::__cxx11::string::append((string *)local_188);
    std::__cxx11::string::~string((string *)auStack_308);
    std::__cxx11::string::~string((string *)&name_1.super_IString.str._M_str);
  }
  local_50 = options;
  IString::IString((IString *)auStack_308,(string *)local_188);
  (local_40->name).super_IString.str._M_len = (size_t)auStack_308;
  (local_40->name).super_IString.str._M_str =
       (char *)updater.
               super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
               .replacep;
  local_58 = CONCAT71(local_58._1_7_,
                      local_60->insideATry &
                      *(byte *)&(local_68->
                                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                ).
                                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                .stack.fixed._M_elems[3].func);
  NVar27.super_IString.str._M_str = (char *)local_40;
  NVar27.super_IString.str._M_len = (size_t)(local_40->name).super_IString.str._M_str;
  pBVar12 = local_40;
  bVar5 = BranchUtils::hasBranchTarget
                    ((BranchUtils *)this_00->body,
                     (Expression *)(local_40->name).super_IString.str._M_len,NVar27);
  if ((bVar5) ||
     (((char)local_58 == '\0' &&
      (target.super_IString.str._M_str = (char *)pBVar12,
      target.super_IString.str._M_len = (size_t)(local_40->name).super_IString.str._M_str,
      bVar5 = BranchUtils::BranchSeeker::has
                        (local_68,(Expression *)(local_40->name).super_IString.str._M_len,target),
      bVar5)))) {
    BranchUtils::getBranchTargets((NameSet *)auStack_308,this_00->body);
    if ((char)local_58 == '\0') {
      BranchUtils::BranchAccumulator::get
                ((NameSet *)&name_1.super_IString.str._M_str,(Expression *)local_68);
    }
    else {
      intoNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&intoNames;
      name_1.super_IString.str._M_str = (char *)0x0;
      intoNames._M_t._M_impl._0_8_ = 0;
      intoNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      intoNames._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      intoNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      intoNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           intoNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
    this_01 = (Names *)(local_40->name).super_IString.str._M_len;
    pcVar1 = (local_40->name).super_IString.str._M_str;
    local_130 = std::
                _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:497:52)>
                ::_M_invoke;
    local_138 = std::
                _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:497:52)>
                ::_M_manager;
    local_148._M_unused._M_object = (NameSet *)auStack_308;
    local_148._8_8_ = ppcVar24;
    std::__cxx11::string::string<std::allocator<char>>
              (local_348,"_",(allocator<char> *)local_a0._M_pod_data);
    root.super_IString.str._M_str = (char *)&local_148;
    root.super_IString.str._M_len = (size_t)pcVar1;
    sVar26 = (string_view)
             Names::getValidName(this_01,root,(function<bool_(wasm::Name)> *)0x0,(Index)local_348,
                                 in_R9);
    (local_40->name).super_IString.str = sVar26;
    std::__cxx11::string::~string(local_348);
    std::_Function_base::~_Function_base((_Function_base *)&local_148);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&name_1.super_IString.str._M_str);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_308);
  }
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&updater.localMapping;
  auStack_308 = (undefined1  [8])0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .replacep = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currFunction = (Function *)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .currModule = (Module *)0x0;
  updater.localMapping._M_t._M_impl._0_4_ = 0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  updater.returnName.super_IString.str._M_len = 0;
  updater.returnName.super_IString.str._M_str = (char *)0x0;
  updater.builder = (Builder *)local_50;
  updater.returnCallInfos.
  super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.options = (PassOptions *)0x0;
  updater.returnCallInfos.
  super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48;
  updater.
  super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  .tryDepth = (size_t)contents;
  local_50 = (PassOptions *)&this_00->type;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  SVar25 = HeapType::getSignature((HeapType *)local_50);
  updater.returnName.super_IString.str._M_str = (char *)SVar25.results.id;
  updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (local_40->name).super_IString.str._M_len;
  updater.returnName.super_IString.str._M_len = (size_t)(local_40->name).super_IString.str._M_str;
  updater.resultType.id._0_1_ =
       *(undefined1 *)
        &(local_68->
         super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
         ).
         super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
         .stack.fixed._M_elems[3].func;
  updater._304_8_ = &old;
  uVar23 = 0;
  while( true ) {
    name_1.super_IString.str._M_str = (char *)CONCAT44(name_1.super_IString.str._M_str._4_4_,uVar23)
    ;
    sVar9 = Function::getNumLocals(this_00);
    if (sVar9 <= uVar23) break;
    TVar10 = Function::getLocalType(this_00,(Index)name_1.super_IString.str._M_str);
    IVar6 = Builder::addVar(local_48,TVar10);
    pmVar11 = std::
              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)&updater.module,(key_type *)&name_1.super_IString.str._M_str);
    *pmVar11 = IVar6;
    uVar23 = (Index)name_1.super_IString.str._M_str + 1;
  }
  if ((char)local_58 == '\0') {
    pEVar22 = &local_40->list;
    pPVar4 = &local_68->
              super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    ;
    uVar23 = 0;
    while( true ) {
      local_a0._0_4_ = uVar23;
      SVar25 = HeapType::getSignature((HeapType *)local_50);
      name_1.super_IString.str._M_str = (char *)SVar25.params.id;
      sVar9 = wasm::Type::size((Type *)&name_1.super_IString.str._M_str);
      if (sVar9 <= uVar23) break;
      pmVar11 = std::
                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)&updater.module,(key_type *)local_a0._M_pod_data);
      IVar6 = *pmVar11;
      ppEVar14 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            &(pPVar4->
                             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                             ).stack.fixed,local_a0._M_unused._M_member_pointer & 0xffffffff);
      pLVar15 = Builder::makeLocalSet((Builder *)&old,IVar6,*ppEVar14);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar22->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar15);
      uVar23 = local_a0._0_4_ + 1;
    }
    uVar23 = 0;
    while( true ) {
      pTVar2 = (this_00->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = (long)(this_00->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3;
      if (uVar19 <= uVar23) break;
      TVar10.id = pTVar2[uVar23].id;
      bVar5 = LiteralUtils::canMakeZero(TVar10);
      if (bVar5) {
        IVar6 = Function::getVarIndexBase(this_00);
        name_1.super_IString.str._M_str =
             (char *)CONCAT44(name_1.super_IString.str._M_str._4_4_,IVar6 + uVar23);
        pmVar11 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)&updater.module,(key_type *)&name_1.super_IString.str._M_str);
        IVar6 = *pmVar11;
        pEVar18 = LiteralUtils::makeZero(TVar10,(Module *)contents);
        pLVar15 = Builder::makeLocalSet((Builder *)&old,IVar6,pEVar18);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar22->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar15);
      }
      uVar23 = uVar23 + 1;
    }
    if (*(char *)&(local_68->
                  super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  ).
                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  .stack.fixed._M_elems[3].func == '\0') {
      *local_60->callSite = (Expression *)local_40;
    }
    else {
      if (local_60->insideATry == true) {
        __assert_fail("!action.insideATry",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                      ,0x23a,
                      "void wasm::(anonymous namespace)::doCodeInlining(Module *, Function *, const InliningAction &, PassOptions &)"
                     );
      }
      if ((ulong)local_70 < 2) {
        pRVar13 = MixedArena::alloc<wasm::Return>((MixedArena *)(old + 0x20));
        pRVar13->value = (Expression *)0x0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar19;
        pBVar12 = Builder::makeSequence
                            ((Builder *)&old,(Expression *)local_40,(Expression *)pRVar13,type_00);
      }
      else {
        pBVar12 = (Block *)MixedArena::alloc<wasm::Return>((MixedArena *)(old + 0x20));
        (pBVar12->name).super_IString.str._M_len = (size_t)local_40;
      }
      *local_60->callSite = (Expression *)pBVar12;
    }
  }
  else {
    ppcVar24 = &name_1.super_IString.str._M_str;
    BranchUtils::BranchAccumulator::get((NameSet *)ppcVar24,local_48->body);
    Name::Name(&local_158,"__original_body");
    local_128._8_8_ = 0;
    local_110 = std::
                _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:522:27)>
                ::_M_invoke;
    local_118 = std::
                _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:522:27)>
                ::_M_manager;
    local_128._M_unused._M_object = ppcVar24;
    std::__cxx11::string::string<std::allocator<char>>
              (local_328,"_",(allocator<char> *)local_a0._M_pod_data);
    root_00.super_IString.str._M_str = (char *)&local_128;
    root_00.super_IString.str._M_len = (size_t)local_158.super_IString.str._M_str;
    NVar27 = Names::getValidName((Names *)local_158.super_IString.str._M_len,root_00,
                                 (function<bool_(wasm::Name)> *)0x0,(Index)local_328,in_R9);
    name_02.super_IString.str._M_str = NVar27.super_IString.str._M_str;
    local_58 = NVar27.super_IString.str._M_len;
    std::__cxx11::string::~string(local_328);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    if ((ulong)local_70 < 2) {
      updater.returnCallInfos.
      super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48->body;
      pRVar13 = MixedArena::alloc<wasm::Return>((MixedArena *)(old + 0x20));
      pRVar13->value = (Expression *)0x0;
      local_a0._M_unused._M_object =
           &updater.returnCallInfos.
            super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a0._8_8_ = 2;
      in_R9 = (string *)0x1;
      name_03.super_IString.str._M_str = name_02.super_IString.str._M_str;
      name_03.super_IString.str._M_len = local_58;
      pBVar12 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                          ((Builder *)&old,name_03,(initializer_list<wasm::Expression_*> *)&local_a0
                           ,(optional<wasm::Type>)(ZEXT816(1) << 0x40));
    }
    else {
      pEVar18 = local_48->body;
      updater.returnCallInfos.
      super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)MixedArena::alloc<wasm::Return>((MixedArena *)(old + 0x20));
      ((Return *)
      updater.returnCallInfos.
      super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage)->value = pEVar18;
      local_a0._M_unused._M_object =
           &updater.returnCallInfos.
            super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a0._8_8_ = 1;
      in_R9 = (string *)0x1;
      name_02.super_IString.str._M_len = local_58;
      pBVar12 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                          ((Builder *)&old,name_02,(initializer_list<wasm::Expression_*> *)&local_a0
                           ,(optional<wasm::Type>)(ZEXT816(1) << 0x40));
    }
    local_48->body = (Expression *)pBVar12;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_70;
    pBVar12 = Builder::makeSequence
                        ((Builder *)&old,(Expression *)pBVar12,(Expression *)local_40,type);
    local_48->body = (Expression *)pBVar12;
    SVar25 = HeapType::getSignature((HeapType *)local_50);
    local_a0._M_unused._0_8_ = (undefined8)SVar25.params.id;
    sVar9 = wasm::Type::size((Type *)&local_a0);
    if (sVar9 == 0) {
      name_05.super_IString.str._M_str = name_02.super_IString.str._M_str;
      name_05.super_IString.str._M_len = local_58;
      pPVar17 = (PassOptions *)
                Builder::makeBreak((Builder *)&old,name_05,(Expression *)0x0,(Expression *)0x0);
    }
    else {
      local_f0 = name_02.super_IString.str._M_str;
      local_50 = (PassOptions *)MixedArena::alloc<wasm::Block>((MixedArena *)(old + 0x20));
      pEVar22 = &((Block *)local_50)->list;
      pPVar4 = &local_68->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
      ;
      uVar23 = 0;
      while( true ) {
        local_a0._0_4_ = uVar23;
        if (sVar9 <= uVar23) break;
        pmVar11 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)&updater.module,(key_type *)local_a0._M_pod_data);
        IVar6 = *pmVar11;
        ppEVar14 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)&(pPVar4->
                                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                  ).stack.fixed,local_a0._M_unused._M_member_pointer & 0xffffffff);
        pLVar15 = Builder::makeLocalSet((Builder *)&old,IVar6,*ppEVar14);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar22->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pLVar15);
        uVar23 = local_a0._0_4_ + 1;
      }
      name_04.super_IString.str._M_str = local_f0;
      name_04.super_IString.str._M_len = local_58;
      pBVar16 = Builder::makeBreak((Builder *)&old,name_04,(Expression *)0x0,(Expression *)0x0);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar22->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pBVar16);
      pPVar17 = local_50;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)0x1;
      Block::finalize((Block *)local_50,type_,Unknown);
    }
    *local_60->callSite = (Expression *)pPVar17;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&name_1.super_IString.str._M_str);
  }
  iVar7 = ExpressionManipulator::copy((EVP_PKEY_CTX *)this_00->body,(EVP_PKEY_CTX *)contents);
  local_80 = (Block *)CONCAT44(extraout_var,iVar7);
  debuginfo::copyBetweenFunctions(this_00->body,(Expression *)local_80,this_00,local_48);
  if (((long)updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)updater.
             super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             .stack.fixed._M_elems[9].currp >> 4) +
      (long)updater.
            super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
            .replacep != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Updater, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Updater>]"
                 );
  }
  Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              *)auStack_308,
             TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
             ::scan,(Expression **)&local_80);
  while( true ) {
    if (((long)updater.
               super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)updater.
               super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
               .stack.fixed._M_elems[9].currp >> 4) +
        (long)updater.
              super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
              .replacep == 0) {
      if (updater.options !=
          (PassOptions *)
          updater.returnCallInfos.
          super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pBVar12 = Builder::blockify((Builder *)updater._304_8_,(Expression *)local_80,
                                    (Expression *)0x0);
        local_80 = pBVar12;
        BranchUtils::BranchAccumulator::get
                  ((NameSet *)&name_1.super_IString.str._M_str,(Expression *)pBVar12);
        local_48 = (Function *)&pBVar12->list;
        uVar23 = 0;
        local_50 = (PassOptions *)pBVar12;
        while( true ) {
          pPVar17 = updater.options;
          ppcVar24 = &name_1.super_IString.str._M_str;
          check = (function<bool_(wasm::Name)> *)(ulong)uVar23;
          if ((function<bool_(wasm::Name)> *)
              ((long)updater.returnCallInfos.
                     super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)updater.options >> 4) <=
              check) break;
          Name::Name((Name *)((long)&name.field_2 + 8),"__return_call");
          local_a0._8_8_ = 0;
          local_88 = std::
                     _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:424:26)>
                     ::_M_invoke;
          local_90 = std::
                     _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:424:26)>
                     ::_M_manager;
          this = &updater.returnCallInfos.
                  super__Vector_base<wasm::(anonymous_namespace)::Updater::ReturnCallInfo,_std::allocator<wasm::(anonymous_namespace)::Updater::ReturnCallInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_a0._M_unused._0_8_ = (undefined8)ppcVar24;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)this,"_",(allocator<char> *)&local_108);
          root_01.super_IString.str._M_str = (char *)&local_a0;
          root_01.super_IString.str._M_len = local_160;
          _auStack_e8 = (string_view)
                        Names::getValidName((Names *)name.field_2._8_8_,root_01,check,(Index)this,
                                            in_R9);
          std::__cxx11::string::~string((string *)this);
          std::_Function_base::~_Function_base((_Function_base *)&local_a0);
          std::
          _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
          ::_M_insert_unique<wasm::Name_const&>
                    ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                      *)ppcVar24,(Name *)auStack_e8);
          this_03 = local_50;
          lVar3 = *(long *)(&pPVar17->debug + (long)check * 0x10 + 8);
          *(undefined1 (*) [8])(lVar3 + 0x10) = auStack_e8;
          *(size_t *)(lVar3 + 0x18) = name_1.super_IString.str._M_len;
          type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)
               (((SpecificExpression<(wasm::Expression::Id)1> *)&local_50->debug)->super_Expression)
               .type.id;
          pBVar12 = Builder::makeBlock<ArenaVector<wasm::Expression_*>,_true>
                              ((Builder *)updater._304_8_,
                               (ArenaVector<wasm::Expression_*> *)local_48,type_02);
          this_02 = updater._304_8_;
          (((ExpressionList *)&this_03->ignoreImplicitTraps)->
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).usedElements =
               0;
          if (updater.returnName.super_IString.str._M_str < (char *)0x2) {
            name_01.super_IString.str._M_str = (char *)updater.returnName.super_IString.str._M_len;
            name_01.super_IString.str._M_len =
                 updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count;
            pBVar16 = Builder::makeBreak((Builder *)updater._304_8_,name_01,(Expression *)0x0,
                                         (Expression *)0x0);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (&(pBVar12->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (Expression *)pBVar16);
            (pBVar12->name).super_IString.str._M_len = (size_t)auStack_e8;
            (pBVar12->name).super_IString.str._M_str = (char *)name_1.super_IString.str._M_len;
            (pBVar12->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
                 0;
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       local_48,(Expression *)pBVar12);
          }
          else {
            contents = (Expression *)auStack_e8;
            sVar9 = name_1.super_IString.str._M_len;
            name_00.super_IString.str._M_str = (char *)updater.returnName.super_IString.str._M_len;
            name_00.super_IString.str._M_len =
                 updater.localMapping._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_f8 = Builder::makeBreak((Builder *)updater._304_8_,name_00,(Expression *)pBVar12,
                                          (Expression *)0x0);
            local_108._M_array = (iterator)&local_f8;
            local_108._M_len = 1;
            in_R9 = (string *)0x1;
            name_06.super_IString.str._M_str = (char *)sVar9;
            name_06.super_IString.str._M_len = (size_t)contents;
            pBVar12 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                                ((Builder *)this_02,name_06,&local_108,
                                 (optional<wasm::Type>)(ZEXT816(1) << 0x40));
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       local_48,(Expression *)pBVar12);
            this_03 = local_50;
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     local_48,*(Expression **)(&pPVar17->debug + (long)check * 0x10));
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)updater.returnName.super_IString.str._M_str;
          Block::finalize((Block *)this_03,type__00,Unknown);
          uVar23 = uVar23 + 1;
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&name_1.super_IString.str._M_str);
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(local_40->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)local_80);
      (local_40->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
           (uintptr_t)local_70;
      if (((local_68->
           super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
           ).
           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
           .stack.usedFixed == 1) &&
         (*(char *)&(local_68->
                    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                    ).
                    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                    .stack.fixed._M_elems[3].func == '\0')) {
        _Var21 = local_70;
        if (1 < (ulong)local_70) {
          local_40 = (Block *)Builder::makeDrop((Builder *)&old,(Expression *)local_40);
        }
        pEVar18 = (Expression *)MixedArena::alloc<wasm::Unreachable>((MixedArena *)(old + 0x20));
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = _Var21;
        pBVar12 = Builder::makeSequence((Builder *)&old,(Expression *)local_40,pEVar18,type_01);
        *local_60->callSite = (Expression *)pBVar12;
      }
      Updater::~Updater((Updater *)auStack_308);
      std::__cxx11::string::~string((string *)local_188);
      return;
    }
    if ((pointer)updater.
                 super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                 .stack.fixed._M_elems[9].currp ==
        updater.
        super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (updater.
          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
          .replacep == (Expression **)0x0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x7e,
                      "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::Task, N = 10]"
                     );
      }
      p_Var20 = *(TaskFunc *)
                 ((long)(&updater.
                          super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                          .stack + -1) + 0xb0 +
                 (long)updater.
                       super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                       .replacep * 0x10);
      auStack_308 = *(undefined1 (*) [8])
                     ((long)(&updater.
                              super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                              .
                              super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                              .stack + -1) + 0xb8 +
                     (long)updater.
                           super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                           .replacep * 0x10);
      updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .replacep = (Expression **)
                  ((long)updater.
                         super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                         .
                         super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                         .replacep + -1);
    }
    else {
      p_Var20 = updater.
                super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                .stack.flexible.
                super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].func;
      auStack_308 = (undefined1  [8])
                    updater.
                    super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].currp;
      updater.
      super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           updater.
           super_TryDepthWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
           .
           super_PostWalker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Updater,_wasm::Visitor<wasm::(anonymous_namespace)::Updater,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
    }
    if (*(Expression **)auStack_308 == (Expression *)0x0) break;
    (*p_Var20)((Updater *)auStack_308,(Expression **)auStack_308);
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x132,
                "void wasm::Walker<wasm::(anonymous namespace)::Updater, wasm::Visitor<wasm::(anonymous namespace)::Updater>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Updater, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Updater>]"
               );
}

Assistant:

static void doCodeInlining(Module* module,
                           Function* into,
                           const InliningAction& action,
                           PassOptions& options) {
  Function* from = action.contents;
  auto* call = (*action.callSite)->cast<Call>();

  // Works for return_call, too
  Type retType = module->getFunction(call->target)->getResults();

  // Build the block that will contain the inlined contents.
  Builder builder(*module);
  auto* block = builder.makeBlock();
  auto name = std::string("__inlined_func$") + from->name.toString();
  if (action.nameHint) {
    name += '$' + std::to_string(action.nameHint);
  }
  block->name = Name(name);

  // In the unlikely event that the function already has a branch target with
  // this name, fix that up, as otherwise we can get unexpected capture of our
  // branches, that is, we could end up with this:
  //
  //  (block $X             ;; a new block we add as the target of returns
  //    (from's contents
  //      (block $X         ;; a block in from's contents with a colliding name
  //        (br $X          ;; a new br we just added that replaces a return
  //
  // Here the br wants to go to the very outermost block, to represent a
  // return from the inlined function's code, but it ends up captured by an
  // internal block. We also need to be careful of the call's children:
  //
  //  (block $X             ;; a new block we add as the target of returns
  //    (local.set $param
  //      (call's first parameter
  //        (br $X)         ;; nested br in call's first parameter
  //      )
  //    )
  //
  // (In this case we could use a second block and define the named block $X
  // after the call's parameters, but that adds work for an extremely rare
  // situation.) The latter case does not apply if the call is a
  // return_call inside a try, because in that case the call's
  // children do not appear inside the same block as the inlined body.
  bool hoistCall = call->isReturn && action.insideATry;
  if (BranchUtils::hasBranchTarget(from->body, block->name) ||
      (!hoistCall && BranchUtils::BranchSeeker::has(call, block->name))) {
    auto fromNames = BranchUtils::getBranchTargets(from->body);
    auto callNames = hoistCall ? BranchUtils::NameSet{}
                               : BranchUtils::BranchAccumulator::get(call);
    block->name = Names::getValidName(block->name, [&](Name test) {
      return !fromNames.count(test) && !callNames.count(test);
    });
  }

  // Prepare to update the inlined code's locals and other things.
  Updater updater(options);
  updater.setFunction(into);
  updater.module = module;
  updater.resultType = from->getResults();
  updater.returnName = block->name;
  updater.isReturn = call->isReturn;
  updater.builder = &builder;
  // Set up a locals mapping
  for (Index i = 0; i < from->getNumLocals(); i++) {
    updater.localMapping[i] = builder.addVar(into, from->getLocalType(i));
  }

  if (hoistCall) {
    // Wrap the existing function body in a block we can branch out of before
    // entering the inlined function body. This block must have a name that is
    // different from any other block name above the branch.
    auto intoNames = BranchUtils::BranchAccumulator::get(into->body);
    auto bodyName =
      Names::getValidName(Name("__original_body"),
                          [&](Name test) { return !intoNames.count(test); });
    if (retType.isConcrete()) {
      into->body = builder.makeBlock(
        bodyName, {builder.makeReturn(into->body)}, Type::none);
    } else {
      into->body = builder.makeBlock(
        bodyName, {into->body, builder.makeReturn()}, Type::none);
    }

    // Sequence the inlined function body after the original caller body.
    into->body = builder.makeSequence(into->body, block, retType);

    // Replace the original callsite with an expression that assigns the
    // operands into the params and branches out of the original body.
    auto numParams = from->getParams().size();
    if (numParams) {
      auto* branchBlock = builder.makeBlock();
      for (Index i = 0; i < numParams; i++) {
        branchBlock->list.push_back(
          builder.makeLocalSet(updater.localMapping[i], call->operands[i]));
      }
      branchBlock->list.push_back(builder.makeBreak(bodyName));
      branchBlock->finalize(Type::unreachable);
      *action.callSite = branchBlock;
    } else {
      *action.callSite = builder.makeBreak(bodyName);
    }
  } else {
    // Assign the operands into the params
    for (Index i = 0; i < from->getParams().size(); i++) {
      block->list.push_back(
        builder.makeLocalSet(updater.localMapping[i], call->operands[i]));
    }
    // Zero out the vars (as we may be in a loop, and may depend on their
    // zero-init value
    for (Index i = 0; i < from->vars.size(); i++) {
      auto type = from->vars[i];
      if (!LiteralUtils::canMakeZero(type)) {
        // Non-zeroable locals do not need to be zeroed out. As they have no
        // zero value they by definition should not be used before being written
        // to, so any value we set here would not be observed anyhow.
        continue;
      }
      block->list.push_back(
        builder.makeLocalSet(updater.localMapping[from->getVarIndexBase() + i],
                             LiteralUtils::makeZero(type, *module)));
    }
    if (call->isReturn) {
      assert(!action.insideATry);
      if (retType.isConcrete()) {
        *action.callSite = builder.makeReturn(block);
      } else {
        *action.callSite = builder.makeSequence(block, builder.makeReturn());
      }
    } else {
      *action.callSite = block;
    }
  }

  // Generate and update the inlined contents
  auto* contents = ExpressionManipulator::copy(from->body, *module);
  debuginfo::copyBetweenFunctions(from->body, contents, from, into);
  updater.walk(contents);
  block->list.push_back(contents);
  block->type = retType;

  // The ReFinalize below will handle propagating unreachability if we need to
  // do so, that is, if the call was reachable but now the inlined content we
  // replaced it with was unreachable. The opposite case requires special
  // handling: ReFinalize works under the assumption that code can become
  // unreachable, but it does not go back from that state. But inlining can
  // cause that:
  //
  //  (call $A                               ;; an unreachable call
  //    (unreachable)
  //  )
  // =>
  //  (block $__inlined_A_body (result i32)  ;; reachable code after inlining
  //    (unreachable)
  //  )
  //
  // That is, if the called function wraps the input parameter in a block with a
  // declared type, then the block is not unreachable. And then we might error
  // if the outside expects the code to be unreachable - perhaps it only
  // validates that way. To fix this, if the call was unreachable then we make
  // the inlined code unreachable as well. That also maximizes DCE
  // opportunities by propagating unreachability as much as possible.
  //
  // (Note that we don't need to do this for a return_call, which is always
  // unreachable anyhow.)
  if (call->type == Type::unreachable && !call->isReturn) {
    // Make the replacement code unreachable. Note that we can't just add an
    // unreachable at the end, as the block might have breaks to it (returns are
    // transformed into those).
    Expression* old = block;
    if (old->type.isConcrete()) {
      old = builder.makeDrop(old);
    }
    *action.callSite = builder.makeSequence(old, builder.makeUnreachable());
  }
}